

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t process_extra(archive_read *a,archive_entry *entry,char *p,size_t extra_length,
                     zip_entry *zip_entry)

{
  byte bVar1;
  void *pvVar2;
  code *pcVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint64_t uVar8;
  archive_string_conv *paVar9;
  char *__s;
  size_t sVar10;
  ulong uVar11;
  uint local_a4;
  wchar_t gidsize;
  wchar_t uidsize;
  unsigned_long utf_crc;
  unsigned_long file_crc;
  char *cp;
  uint32_t comment_length;
  uint32_t external_attributes;
  uint32_t internal_attributes;
  wchar_t bitmap_last;
  wchar_t bitmap;
  wchar_t flags;
  uint64_t t_2;
  uint64_t t_1;
  uint64_t t;
  unsigned_short datasize;
  ulong uStack_50;
  unsigned_short headerid;
  size_t i;
  zip *zip;
  uint offset;
  zip_entry *zip_entry_local;
  size_t extra_length_local;
  char *p_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  zip._4_4_ = 0;
  pvVar2 = a->format->data;
  if (extra_length != 0) {
    if (extra_length < 4) {
      for (uStack_50 = 0; uStack_50 < extra_length; uStack_50 = uStack_50 + 1) {
        if (p[uStack_50] != '\0') {
          archive_set_error(&a->archive,0x54,
                            "Too-small extra data: Need at least 4 bytes, but only found %d bytes",
                            extra_length & 0xffffffff);
          return L'\xffffffe7';
        }
      }
    }
    else {
      for (; (ulong)zip._4_4_ <= extra_length - 4; zip._4_4_ = t._4_2_ + zip._4_4_) {
        uVar4 = archive_le16dec(p + zip._4_4_);
        uVar5 = archive_le16dec(p + (ulong)zip._4_4_ + 2);
        uVar6 = zip._4_4_ + 4;
        if (extra_length < uVar6 + uVar5) {
          archive_set_error(&a->archive,0x54,
                            "Extra data overflow: Need %d bytes but only found %d bytes",
                            (ulong)uVar5,(ulong)((int)extra_length - uVar6));
          return L'\xffffffe7';
        }
        t._4_2_ = uVar5;
        if (uVar4 == 1) {
          zip_entry->flags = zip_entry->flags | 1;
          if (zip_entry->uncompressed_size == 0xffffffff) {
            if ((uVar5 < 8) || (uVar8 = archive_le64dec(p + uVar6), 0x7fffffffffffffff < uVar8)) {
              archive_set_error(&a->archive,0x54,"Malformed 64-bit uncompressed size");
              return L'\xffffffe7';
            }
            zip_entry->uncompressed_size = uVar8;
            t._4_2_ = uVar5 - 8;
            uVar6 = zip._4_4_ + 0xc;
          }
          zip._4_4_ = uVar6;
          if (zip_entry->compressed_size == 0xffffffff) {
            if ((t._4_2_ < 8) ||
               (uVar8 = archive_le64dec(p + zip._4_4_), 0x7fffffffffffffff < uVar8)) {
              archive_set_error(&a->archive,0x54,"Malformed 64-bit compressed size");
              return L'\xffffffe7';
            }
            zip_entry->compressed_size = uVar8;
            zip._4_4_ = zip._4_4_ + 8;
            t._4_2_ = t._4_2_ - 8;
          }
          uVar6 = zip._4_4_;
          if (zip_entry->local_header_offset == 0xffffffff) {
            if ((t._4_2_ < 8) ||
               (uVar8 = archive_le64dec(p + zip._4_4_), 0x7fffffffffffffff < uVar8)) {
              archive_set_error(&a->archive,0x54,"Malformed 64-bit local header offset");
              return L'\xffffffe7';
            }
            zip_entry->local_header_offset = uVar8;
            t._4_2_ = t._4_2_ - 8;
            uVar6 = zip._4_4_ + 8;
          }
        }
        else if (uVar4 == 0x5455) {
          if (uVar5 == 0) {
            archive_set_error(&a->archive,0x54,"Incomplete extended time field");
            return L'\xffffffe7';
          }
          bVar1 = p[uVar6];
          uVar6 = zip._4_4_ + 5;
          t._4_2_ = uVar5 - 1;
          if ((bVar1 & 1) != 0) {
            if (t._4_2_ < 4) goto LAB_00ba4532;
            uVar7 = archive_le32dec(p + uVar6);
            zip_entry->mtime = (ulong)uVar7;
            t._4_2_ = uVar5 - 5;
            uVar6 = zip._4_4_ + 9;
          }
          zip._4_4_ = uVar6;
          if ((bVar1 & 2) != 0) {
            uVar6 = zip._4_4_;
            if (t._4_2_ < 4) goto LAB_00ba4532;
            uVar7 = archive_le32dec(p + zip._4_4_);
            zip_entry->atime = (ulong)uVar7;
            zip._4_4_ = zip._4_4_ + 4;
            t._4_2_ = t._4_2_ - 4;
          }
          uVar6 = zip._4_4_;
          if (((bVar1 & 4) != 0) && (3 < t._4_2_)) {
            uVar7 = archive_le32dec(p + zip._4_4_);
            zip_entry->ctime = (ulong)uVar7;
            t._4_2_ = t._4_2_ - 4;
            uVar6 = zip._4_4_ + 4;
          }
        }
        else if (uVar4 == 0x5855) {
          if (7 < uVar5) {
            uVar7 = archive_le32dec(p + uVar6);
            zip_entry->atime = (ulong)uVar7;
            uVar7 = archive_le32dec(p + (ulong)uVar6 + 4);
            zip_entry->mtime = (ulong)uVar7;
          }
          if (0xb < uVar5) {
            uVar5 = archive_le16dec(p + (ulong)uVar6 + 8);
            zip_entry->uid = (ulong)uVar5;
            uVar5 = archive_le16dec(p + (ulong)uVar6 + 10);
            zip_entry->gid = (ulong)uVar5;
          }
        }
        else if (uVar4 == 0x6c78) {
          if (uVar5 != 0) {
            bVar1 = p[uVar6];
            zip._4_4_ = zip._4_4_ + 5;
            external_attributes = (uint32_t)bVar1;
            while (t._4_2_ = uVar5 - 1, (external_attributes & 0x80) != 0 && t._4_2_ != 0) {
              uVar11 = (ulong)zip._4_4_;
              zip._4_4_ = zip._4_4_ + 1;
              uVar5 = t._4_2_;
              external_attributes = (uint32_t)p[uVar11];
            }
            if ((bVar1 & 1) != 0) {
              uVar6 = zip._4_4_;
              if (t._4_2_ < 2) goto LAB_00ba4532;
              uVar4 = archive_le16dec(p + zip._4_4_);
              zip_entry->system = (uchar)(uVar4 >> 8);
              zip._4_4_ = zip._4_4_ + 2;
              t._4_2_ = uVar5 - 3;
            }
            if ((bVar1 & 2) != 0) {
              uVar6 = zip._4_4_;
              if (t._4_2_ < 2) goto LAB_00ba4532;
              archive_le16dec(p + zip._4_4_);
              zip._4_4_ = zip._4_4_ + 2;
              t._4_2_ = t._4_2_ - 2;
            }
            if ((bVar1 & 4) != 0) {
              uVar6 = zip._4_4_;
              if (t._4_2_ < 4) goto LAB_00ba4532;
              uVar7 = archive_le32dec(p + zip._4_4_);
              if (zip_entry->system == '\x03') {
                zip_entry->mode = (uint16_t)(uVar7 >> 0x10);
              }
              else if (zip_entry->system == '\0') {
                if ((uVar7 & 0x10) == 0x10) {
                  zip_entry->mode = 0x41fd;
                }
                else {
                  zip_entry->mode = 0x81b4;
                }
                if ((uVar7 & 1) == 1) {
                  zip_entry->mode = zip_entry->mode & 0x16d;
                }
              }
              else {
                zip_entry->mode = 0;
              }
              zip._4_4_ = zip._4_4_ + 4;
              t._4_2_ = t._4_2_ - 4;
            }
            uVar6 = zip._4_4_;
            if (((bVar1 & 8) != 0) && (1 < t._4_2_)) {
              uVar5 = archive_le16dec(p + zip._4_4_);
              t._4_2_ = t._4_2_ - 2;
              uVar6 = zip._4_4_ + 2;
              if ((uint)uVar5 <= (uint)t._4_2_) {
                t._4_2_ = t._4_2_ - uVar5;
                uVar6 = (uint)uVar5 + zip._4_4_ + 2;
              }
            }
          }
        }
        else if (uVar4 == 0x7075) {
          if ((4 < uVar5) && (entry != (archive_entry *)0x0)) {
            uVar6 = zip._4_4_ + 9;
            t._4_2_ = uVar5 - 5;
            if (*(long *)((long)pvVar2 + 0x1f38) == 0) {
              paVar9 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
              *(archive_string_conv **)((long)pvVar2 + 0x1f38) = paVar9;
              if (*(long *)((long)pvVar2 + 0x1f38) == 0) goto LAB_00ba4532;
            }
            if ((*(char *)((long)pvVar2 + 0xa0) == '\0') &&
               (__s = archive_entry_pathname(entry), __s != (char *)0x0)) {
              pcVar3 = *(code **)((long)pvVar2 + 0x98);
              sVar10 = strlen(__s);
              uVar11 = (*pcVar3)(0,__s,sVar10);
              uVar7 = archive_le32dec(p + ((ulong)uVar6 - 4));
              if (uVar11 != uVar7) goto LAB_00ba4532;
            }
            _archive_entry_copy_pathname_l
                      (entry,p + uVar6,(ulong)t._4_2_,
                       *(archive_string_conv **)((long)pvVar2 + 0x1f38));
          }
        }
        else if (uVar4 == 0x7855) {
          if (1 < uVar5) {
            uVar4 = archive_le16dec(p + uVar6);
            zip_entry->uid = (ulong)uVar4;
          }
          if (3 < uVar5) {
            uVar5 = archive_le16dec(p + (ulong)uVar6 + 2);
            zip_entry->gid = (ulong)uVar5;
          }
        }
        else if (uVar4 == 0x7875) {
          local_a4 = 0;
          if ((uVar5 != 0) && (p[uVar6] == '\x01')) {
            if (3 < uVar5) {
              local_a4 = (uint)(byte)p[zip._4_4_ + 5];
              if (local_a4 == 2) {
                uVar4 = archive_le16dec(p + (ulong)uVar6 + 2);
                zip_entry->uid = (ulong)uVar4;
              }
              else if ((local_a4 == 4) && (5 < uVar5)) {
                uVar7 = archive_le32dec(p + (ulong)uVar6 + 2);
                zip_entry->uid = (ulong)uVar7;
              }
            }
            if (local_a4 + 5 <= (uint)uVar5) {
              if (p[zip._4_4_ + 6 + local_a4] == '\x02') {
                uVar5 = archive_le16dec(p + (long)(int)local_a4 + (ulong)uVar6 + 3);
                zip_entry->gid = (ulong)uVar5;
              }
              else if ((p[zip._4_4_ + 6 + local_a4] == '\x04') && (local_a4 + 7 <= (uint)uVar5)) {
                uVar7 = archive_le32dec(p + (long)(int)local_a4 + (ulong)uVar6 + 3);
                zip_entry->gid = (ulong)uVar7;
              }
            }
          }
        }
        else if (uVar4 == 0x9901) {
          if (uVar5 < 6) {
            archive_set_error(&a->archive,0x54,"Incomplete AES field");
            return L'\xffffffe7';
          }
          if ((p[zip._4_4_ + 6] == 'A') && (p[zip._4_4_ + 7] == 'E')) {
            uVar5 = archive_le16dec(p + uVar6);
            (zip_entry->aes_extra).vendor = (uint)uVar5;
            (zip_entry->aes_extra).strength = (int)p[zip._4_4_ + 8];
            (zip_entry->aes_extra).compression = p[zip._4_4_ + 9];
          }
        }
LAB_00ba4532:
        zip._4_4_ = uVar6;
      }
    }
  }
  return L'\0';
}

Assistant:

static int
process_extra(struct archive_read *a, struct archive_entry *entry,
     const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;
	struct zip *zip = (struct zip *)(a->format->data);

	if (extra_length == 0) {
		return ARCHIVE_OK;
	}

	if (extra_length < 4) {
		size_t i = 0;
		/* Some ZIP files may have trailing 0 bytes. Let's check they
		 * are all 0 and ignore them instead of returning an error.
		 *
		 * This is not technically correct, but some ZIP files look
		 * like this and other tools support those files - so let's
		 * also  support them.
		 */
		for (; i < extra_length; i++) {
			if (p[i] != 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Too-small extra data: "
				    "Need at least 4 bytes, "
				    "but only found %d bytes",
				    (int)extra_length);
				return ARCHIVE_FAILED;
			}
		}

		return ARCHIVE_OK;
	}

	while (offset <= extra_length - 4) {
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);

		offset += 4;
		if (offset + datasize > extra_length) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT, "Extra data overflow: "
			    "Need %d bytes but only found %d bytes",
			    (int)datasize, (int)(extra_length - offset));
			return ARCHIVE_FAILED;
		}
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%04x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "uncompressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->uncompressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "compressed size");
					return ARCHIVE_FAILED;
				}
				zip_entry->compressed_size = t;
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				uint64_t t = 0;
				if (datasize < 8
				    || (t = archive_le64dec(p + offset)) >
				    INT64_MAX) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_FILE_FORMAT,
					    "Malformed 64-bit "
					    "local header offset");
					return ARCHIVE_FAILED;
				}
				zip_entry->local_header_offset = t;
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
#ifdef DEBUG
		case 0x0017:
		{
			/* Strong encryption field. */
			if (archive_le16dec(p + offset) == 2) {
				unsigned algId =
					archive_le16dec(p + offset + 2);
				unsigned bitLen =
					archive_le16dec(p + offset + 4);
				int	 flags =
					archive_le16dec(p + offset + 6);
				fprintf(stderr, "algId=0x%04x, bitLen=%u, "
				    "flgas=%d\n", algId, bitLen,flags);
			}
			break;
		}
#endif
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags;
			if (datasize == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete extended time field");
				return ARCHIVE_FAILED;
			}
			flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c78:
		{
			/* Experimental 'xl' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes (and other
			 * fields that ordinarily appear only in
			 * central directory) in local file header.
			 * This provides file type and permission
			 * information necessary to support full
			 * streaming extraction.  Currently being
			 * discussed with other Zip developers
			 * ... subject to change.
			 *
			 * Format:
			 *  The field starts with a bitmap that specifies
			 *  which additional fields are included.  The
			 *  bitmap is variable length and can be extended in
			 *  the future.
			 *
			 *  n bytes - feature bitmap: first byte has low-order
			 *    7 bits.  If high-order bit is set, a subsequent
			 *    byte holds the next 7 bits, etc.
			 *
			 *  if bitmap & 1, 2 byte "version made by"
			 *  if bitmap & 2, 2 byte "internal file attributes"
			 *  if bitmap & 4, 4 byte "external file attributes"
			 *  if bitmap & 8, 2 byte comment length + n byte
			 *  comment
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				/* 2 byte "version made by" */
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				/* 2 byte "internal file attributes" */
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				/* Not used by libarchive at present. */
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				/* 4 byte "external file attributes" */
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				} else if (zip_entry->system == 0) {
					// Interpret MSDOS directory bit
					if (0x10 == (external_attributes &
					    0x10)) {
						zip_entry->mode =
						    AE_IFDIR | 0775;
					} else {
						zip_entry->mode =
						    AE_IFREG | 0664;
					}
					if (0x01 == (external_attributes &
					    0x01)) {
						/* Read-only bit;
						 * strip write permissions */
						zip_entry->mode &= 0555;
					}
				} else {
					zip_entry->mode = 0;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				/* 2 byte comment length + comment */
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				/* Comment is not supported by libarchive */
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7075:
		{
			/* Info-ZIP Unicode Path Extra Field. */
			if (datasize < 5 || entry == NULL)
				break;
			offset += 5;
			datasize -= 5;

			/* The path name in this field is always encoded
			 * in UTF-8. */
			if (zip->sconv_utf8 == NULL) {
				zip->sconv_utf8 =
					archive_string_conversion_from_charset(
					&a->archive, "UTF-8", 1);
				/* If the converter from UTF-8 is not
				 * available, then the path name from the main
				 * field will more likely be correct. */
				if (zip->sconv_utf8 == NULL)
					break;
			}

			/* Make sure the CRC32 of the filename matches. */
			if (!zip->ignore_crc32) {
				const char *cp = archive_entry_pathname(entry);
				if (cp) {
					unsigned long file_crc =
					    zip->crc32func(0, cp, strlen(cp));
					unsigned long utf_crc =
					    archive_le32dec(p + offset - 4);
					if (file_crc != utf_crc) {
#ifdef DEBUG
						fprintf(stderr,
						    "CRC filename mismatch; "
						    "CDE is %lx, but UTF8 "
						    "is outdated with %lx\n",
						    file_crc, utf_crc);
#endif
						break;
					}
				}
			}

			if (archive_entry_copy_pathname_l(entry,
			    p + offset, datasize, zip->sconv_utf8) != 0) {
				/* Ignore the error, and fallback to the path
				 * name from the main field. */
#ifdef DEBUG
				fprintf(stderr, "Failed to read the ZIP "
				    "0x7075 extra field path.\n");
#endif
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = 0xff & (int)p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = 0xff &
					    (int)p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		case 0x9901:
			/* WinZip AES extra data field. */
			if (datasize < 6) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Incomplete AES field");
				return ARCHIVE_FAILED;
			}
			if (p[offset + 2] == 'A' && p[offset + 3] == 'E') {
				/* Vendor version. */
				zip_entry->aes_extra.vendor =
				    archive_le16dec(p + offset);
				/* AES encryption strength. */
				zip_entry->aes_extra.strength = p[offset + 4];
				/* Actual compression method. */
				zip_entry->aes_extra.compression =
				    p[offset + 5];
			}
			break;
		default:
			break;
		}
		offset += datasize;
	}
	return ARCHIVE_OK;
}